

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Tee * kj::newTee(Tee *__return_storage_ptr__,Own<kj::AsyncInputStream> *input,uint64_t limit)

{
  Disposer *pDVar1;
  AsyncInputStream *pAVar2;
  AsyncTee *pAVar3;
  Refcounted *refcounted;
  Own<kj::(anonymous_namespace)::TeeBranch> OVar4;
  Own<kj::(anonymous_namespace)::AsyncTee> local_58;
  Own<kj::(anonymous_namespace)::AsyncTee> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pAVar3 = (AsyncTee *)operator_new(0x278);
  pDVar1 = input->disposer;
  pAVar2 = input->ptr;
  input->ptr = (AsyncInputStream *)0x0;
  (pAVar3->super_Refcounted).refcount = 0;
  (pAVar3->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0062b6c0
  ;
  (pAVar3->inner).disposer = pDVar1;
  (pAVar3->inner).ptr = pAVar2;
  pAVar3->bufferSizeLimit = limit;
  (*pAVar2->_vptr_AsyncInputStream[2])(&pAVar3->length);
  pAVar3->branches[0].ptr.isSet = false;
  pAVar3->branches[1].ptr.isSet = false;
  (pAVar3->stoppage).ptr.isSet = false;
  heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
  (pAVar3->pullPromise).super_PromiseBase.node.disposer = (Disposer *)CONCAT44(uStack_34,local_38);
  (pAVar3->pullPromise).super_PromiseBase.node.ptr = (PromiseNode *)CONCAT44(uStack_2c,uStack_30);
  pAVar3->pulling = false;
  (pAVar3->super_Refcounted).refcount = (pAVar3->super_Refcounted).refcount + 2;
  local_58.disposer = (Disposer *)pAVar3;
  local_58.ptr = pAVar3;
  local_48.disposer = (Disposer *)pAVar3;
  local_48.ptr = pAVar3;
  OVar4 = heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
                    ((kj *)&local_38,&local_58,(int *)0x0);
  pAVar3 = local_58.ptr;
  pDVar1 = (Disposer *)CONCAT44(uStack_34,local_38);
  pAVar2 = (AsyncInputStream *)CONCAT44(uStack_2c,uStack_30);
  if (local_58.ptr != (AsyncTee *)0x0) {
    local_58.ptr = (AsyncTee *)0x0;
    (**(((Refcounted *)&(local_58.disposer)->_vptr_Disposer)->super_Disposer)._vptr_Disposer)
              (local_58.disposer,
               (pAVar3->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
               (long)(pAVar3->branches + -1) + 0x28,OVar4.ptr);
  }
  OVar4 = heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
                    ((kj *)&local_38,&local_48,(int *)0x1);
  __return_storage_ptr__->branches[0].disposer = pDVar1;
  __return_storage_ptr__->branches[0].ptr = pAVar2;
  *(undefined4 *)&__return_storage_ptr__->branches[1].disposer = local_38;
  *(undefined4 *)((long)&__return_storage_ptr__->branches[1].disposer + 4) = uStack_34;
  *(undefined4 *)&__return_storage_ptr__->branches[1].ptr = uStack_30;
  *(undefined4 *)((long)&__return_storage_ptr__->branches[1].ptr + 4) = uStack_2c;
  if (local_48.ptr != (AsyncTee *)0x0) {
    (**(((Refcounted *)&(local_48.disposer)->_vptr_Disposer)->super_Disposer)._vptr_Disposer)
              (local_48.disposer,
               ((local_48.ptr)->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
               (long)((local_48.ptr)->branches + -1) + 0x28,OVar4.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

Tee newTee(Own<AsyncInputStream> input, uint64_t limit) {
  auto impl = refcounted<AsyncTee>(mv(input), limit);
  Own<AsyncInputStream> branch1 = heap<TeeBranch>(addRef(*impl), 0);
  Own<AsyncInputStream> branch2 = heap<TeeBranch>(mv(impl), 1);
  return { { mv(branch1), mv(branch2) } };
}